

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O2

MPP_RET vdpu34x_h264d_init(void *hal,MppHalCfg *cfg)

{
  SlotHalFbcAdjCfg *pSVar1;
  MPP_RET MVar2;
  int iVar3;
  RockchipSocType RVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  undefined4 uVar9;
  ulong uVar10;
  int iVar11;
  Vdpu34xRegCommon *common;
  
  if (hal == (void *)0x0) {
    MVar2 = MPP_OK;
    if ((hal_h264d_debug & 4) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"hal_h264d_vdpu34x","input empty(%d).\n",(char *)0x0,0x2c9);
    }
  }
  else {
    pvVar6 = mpp_osal_calloc("vdpu34x_h264d_init",0x448);
    *(void **)((long)hal + 0x90) = pvVar6;
    if (pvVar6 == (void *)0x0) {
      if ((hal_h264d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu34x","malloc buffer error(%d).\n",(char *)0x0,0x2cb);
      }
      MVar2 = MPP_ERR_MALLOC;
      if (((hal_h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"hal_h264d_vdpu34x","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "vdpu34x_h264d_init",0x2cb), (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
    }
    else {
      iVar11 = (uint)(*(int *)((long)hal + 0x98) != 0) * 2 + 1;
      MVar2 = mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x68),(MppBuffer *)((long)pvVar6 + 0x310),
                         (ulong)(iVar11 * 0x6000 | 0x1000),"hal_h264d_vdpu34x","vdpu34x_h264d_init")
      ;
      if (MPP_NOK < MVar2) {
        iVar3 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)((long)pvVar6 + 0x310),"vdpu34x_h264d_init");
        *(int *)((long)pvVar6 + 0x318) = iVar3;
        pvVar7 = mpp_buffer_get_ptr_with_caller
                           (*(MppBuffer *)((long)pvVar6 + 0x310),"vdpu34x_h264d_init");
        *(void **)((long)pvVar6 + 800) = pvVar7;
        *(undefined8 *)((long)pvVar6 + 0x328) = 0x100000000000;
        iVar3 = 0x6000;
        for (uVar10 = 0; (uint)(iVar11 * 4) != uVar10; uVar10 = uVar10 + 4) {
          pvVar7 = mpp_osal_calloc("vdpu34x_h264d_init",0x2a0);
          *(void **)((long)pvVar6 + uVar10 * 4 + 0x360) = pvVar7;
          *(byte *)((long)pvVar7 + 0x1c) = *(byte *)((long)pvVar7 + 0x1c) & 0xfd;
          *(uint *)((long)pvVar7 + 0x24) = *(uint *)((long)pvVar7 + 0x24) & 0xfe000000 | 0x3fff;
          *(ulong *)((long)pvVar7 + 4) =
               CONCAT44(*(undefined4 *)((long)pvVar7 + 8),*(undefined4 *)((long)pvVar7 + 4)) &
               0xfffffffffffffc00 | 0x100000001;
          *(ulong *)((long)pvVar7 + 0xc) = *(ulong *)((long)pvVar7 + 0xc) | 0x8000000060;
          *(uint *)((long)pvVar7 + 0x14) = *(uint *)((long)pvVar7 + 0x14) | 0x48200;
          *(uint *)((long)pvVar7 + 0x34) = *(uint *)((long)pvVar7 + 0x34) & 0xfffffff8 | 6;
          RVar4 = mpp_get_soc_type();
          uVar8 = *(uint *)((long)pvVar7 + 0x44) & 0xc0000000;
          if (RVar4 == ROCKCHIP_SOC_RK3588) {
            uVar5 = *(uint *)((long)pvVar7 + 0x48) & 0xfff00000 | 0xfffef;
            uVar9 = 0;
          }
          else {
            uVar8 = uVar8 | 0x3ff3ffff;
            uVar5 = *(uint *)((long)pvVar7 + 0x48) | 0xfffff;
            uVar9 = 0xffffffff;
          }
          *(undefined4 *)((long)pvVar7 + 0x40) = uVar9;
          *(uint *)((long)pvVar7 + 0x44) = uVar8;
          *(uint *)((long)pvVar7 + 0x48) = uVar5 | 0x80000000;
          *(undefined4 *)((long)pvVar7 + 0x60) = 0x3ffff;
          *(uint *)((long)pvVar7 + 0xc) = *(uint *)((long)pvVar7 + 0xc) & 0xffffffd9 | 0x22;
          *(byte *)((long)pvVar7 + 0x14) = *(byte *)((long)pvVar7 + 0x14) | 1;
          *(int *)((long)pvVar6 + uVar10 + 0x330) = iVar3 + -0x5000;
          *(int *)((long)pvVar6 + uVar10 + 0x33c) = iVar3 + -0x1000;
          *(int *)((long)pvVar6 + uVar10 + 0x348) = iVar3;
          iVar3 = iVar3 + 0x6000;
        }
        if (*(int *)((long)hal + 0x98) == 0) {
          *(undefined8 *)((long)pvVar6 + 0x440) = *(undefined8 *)((long)pvVar6 + 0x360);
          *(undefined4 *)((long)pvVar6 + 0x388) = *(undefined4 *)((long)pvVar6 + 0x330);
          *(undefined4 *)((long)pvVar6 + 0x38c) = *(undefined4 *)((long)pvVar6 + 0x33c);
          *(undefined4 *)((long)pvVar6 + 0x390) = *(undefined4 *)((long)pvVar6 + 0x348);
        }
        memcpy((void *)((ulong)*(uint *)((long)pvVar6 + 0x328) + *(long *)((long)pvVar6 + 800)),
               rkv_cabac_table_v34x,0xe80);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,rkv_hor_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_VER_ALIGN,rkv_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_LEN_ALIGN,rkv_len_align);
        pSVar1 = cfg->hal_fbc_adj_cfg;
        if (pSVar1 == (SlotHalFbcAdjCfg *)0x0) {
          return MPP_OK;
        }
        pSVar1->func = vdpu34x_afbc_align_calc;
        pSVar1->expand = 0x10;
        return MPP_OK;
      }
      if ((hal_h264d_debug & 4) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu34x","Function error(%d).\n",(char *)0x0,0x2d2);
      }
    }
    vdpu34x_h264d_deinit(hal);
  }
  return MVar2;
}

Assistant:

MPP_RET vdpu34x_h264d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Vdpu34xH264dRegCtx)));
    Vdpu34xH264dRegCtx *reg_ctx = (Vdpu34xH264dRegCtx *)p_hal->reg_ctx;
    RK_U32 max_cnt = p_hal->fast_mode ? VDPU34X_FAST_REG_SET_CNT : 1;
    RK_U32 i = 0;

    //!< malloc buffers
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs,
                                   VDPU34X_INFO_BUFFER_SIZE(max_cnt)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);
    reg_ctx->offset_cabac = VDPU34X_CABAC_TAB_OFFSET;
    reg_ctx->offset_errinfo = VDPU34X_ERROR_INFO_OFFSET;
    for (i = 0; i < max_cnt; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu34xH264dRegSet, 1);
        init_common_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->offset_spspps[i] = VDPU34X_SPSPPS_OFFSET(i);
        reg_ctx->offset_rps[i] = VDPU34X_RPS_OFFSET(i);
        reg_ctx->offset_sclst[i] = VDPU34X_SCALING_LIST_OFFSET(i);
    }

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    //!< copy cabac table bytes
    memcpy((char *)reg_ctx->bufs_ptr + reg_ctx->offset_cabac,
           (void *)rkv_cabac_table_v34x, sizeof(rkv_cabac_table_v34x));

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, rkv_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, rkv_len_align);

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu34x_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

__RETURN:
    return MPP_OK;
__FAILED:
    vdpu34x_h264d_deinit(hal);

    return ret;
}